

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O3

hugeint_t __thiscall duckdb::BaseUUID::FromUHugeint(BaseUUID *this,uhugeint_t input)

{
  hugeint_t hVar1;
  
  hVar1.upper = input.lower ^ 0x8000000000000000;
  hVar1.lower = (uint64_t)this;
  return hVar1;
}

Assistant:

hugeint_t BaseUUID::FromUHugeint(uhugeint_t input) {
	hugeint_t result;
	result.lower = input.lower;
	if (input.upper > uint64_t(NumericLimits<int64_t>::Maximum())) {
		result.upper = int64_t(input.upper - uint64_t(NumericLimits<int64_t>::Maximum()) - 1);
	} else {
		result.upper = int64_t(input.upper) - NumericLimits<int64_t>::Maximum() - 1;
	}
	return result;
}